

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_user.h
# Opt level: O1

void __thiscall fineftp::FtpUser::~FtpUser(FtpUser *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->local_root_path_)._M_dataplus._M_p;
  paVar2 = &(this->local_root_path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->password_)._M_dataplus._M_p;
  paVar2 = &(this->password_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

FtpUser(const std::string& password, const std::string& local_root_path, const Permission permissions)
      : password_       (password)
      , local_root_path_(local_root_path)
      , permissions_    (permissions)
    {}